

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheVk::InitializeResources
          (ShaderResourceCacheVk *this,Uint32 Set,Uint32 Offset,Uint32 ArraySize,DescriptorType Type
          ,bool HasImmutableSampler)

{
  Resource *this_00;
  reference this_01;
  reference local_40;
  uint local_2c;
  DescriptorSet *pDStack_28;
  Uint32 res;
  DescriptorSet *DescrSet;
  bool HasImmutableSampler_local;
  Uint32 UStack_18;
  DescriptorType Type_local;
  Uint32 ArraySize_local;
  Uint32 Offset_local;
  Uint32 Set_local;
  ShaderResourceCacheVk *this_local;
  
  DescrSet._2_1_ = HasImmutableSampler;
  DescrSet._3_1_ = Type;
  DescrSet._4_4_ = ArraySize;
  UStack_18 = Offset;
  ArraySize_local = Set;
  _Offset_local = this;
  pDStack_28 = GetDescriptorSet(this,Set);
  for (local_2c = 0; local_2c < DescrSet._4_4_; local_2c = local_2c + 1) {
    this_00 = DescriptorSet::GetResource(pDStack_28,UStack_18 + local_2c);
    Resource::Resource(this_00,DescrSet._3_1_,(bool)(DescrSet._2_1_ & 1));
    this_01 = std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::operator[](&this->m_DbgInitializedResources,(ulong)ArraySize_local);
    local_40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (this_01,(ulong)UStack_18 + (ulong)local_2c);
    std::_Bit_reference::operator=(&local_40,true);
  }
  return;
}

Assistant:

void ShaderResourceCacheVk::InitializeResources(Uint32 Set, Uint32 Offset, Uint32 ArraySize, DescriptorType Type, bool HasImmutableSampler)
{
    DescriptorSet& DescrSet = GetDescriptorSet(Set);
    for (Uint32 res = 0; res < ArraySize; ++res)
    {
        new (&DescrSet.GetResource(Offset + res)) Resource{Type, HasImmutableSampler};
#ifdef DILIGENT_DEBUG
        m_DbgInitializedResources[Set][size_t{Offset} + res] = true;
#endif
    }
}